

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O0

void Txs3_ManCollectCone_rec(Txs3_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int Entry;
  Gia_Obj_t *pObj_local;
  Txs3_Man_t *p_local;
  
  if (pObj->Value != 0xffffffff) {
    pObj->Value = 0xffffffff;
    iVar2 = Gia_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                      ,0x87,"void Txs3_ManCollectCone_rec(Txs3_Man_t *, Gia_Obj_t *)");
      }
      pGVar4 = Gia_ObjFanin0(pObj);
      Txs3_ManCollectCone_rec(p,pGVar4);
      pGVar4 = Gia_ObjFanin1(pObj);
      Txs3_ManCollectCone_rec(p,pGVar4);
      pVVar1 = p->vNodes;
      iVar2 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(pVVar1,iVar2);
    }
    else {
      iVar2 = Gia_ObjIsPi(p->pGia,pObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjCioId(pObj);
        iVar3 = Gia_ManPiNum(p->pGia);
        iVar2 = Vec_IntEntry(p->vPrio,iVar2 - iVar3);
        if (iVar2 == 0) {
          pVVar1 = p->vFosAbs;
          iVar2 = Gia_ObjId(p->pGia,pObj);
          Vec_IntPush(pVVar1,iVar2);
        }
        else {
          pVVar1 = p->vFosPre;
          iVar2 = Gia_ObjId(p->pGia,pObj);
          Vec_IntPush(pVVar1,iVar2);
        }
      }
      else {
        pVVar1 = p->vCiObjs;
        iVar2 = Gia_ObjId(p->pGia,pObj);
        Vec_IntPush(pVVar1,iVar2);
      }
    }
  }
  return;
}

Assistant:

void Txs3_ManCollectCone_rec( Txs3_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !~pObj->Value )
        return;
    pObj->Value = ~0;
    if ( Gia_ObjIsCi(pObj) )
    {
        int Entry;
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPush( p->vCiObjs, Gia_ObjId(p->pGia, pObj) );
            return;
        }
        Entry = Gia_ObjCioId(pObj) - Gia_ManPiNum(p->pGia);
        if ( Vec_IntEntry(p->vPrio, Entry) ) // present flop
            Vec_IntPush( p->vFosPre, Gia_ObjId(p->pGia, pObj) );
        else // asbstracted flop
            Vec_IntPush( p->vFosAbs, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
    Txs3_ManCollectCone_rec( p, Gia_ObjFanin1(pObj) );
    Vec_IntPush( p->vNodes, Gia_ObjId(p->pGia, pObj) );
}